

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

bool soul::shouldShow(ModuleBase *module,Module *m)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pool_ref *this_00;
  Function *f_00;
  undefined4 extraout_var_00;
  VariableDeclaration *v_00;
  undefined4 extraout_var_01;
  pool_ref<soul::AST::StructDeclaration> *ppVar3;
  StructDeclaration *pSVar4;
  pool_ref<soul::AST::StructDeclaration> *s;
  pool_ref<soul::AST::StructDeclaration> *__end1_1;
  pool_ref<soul::AST::StructDeclaration> *__begin1_1;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> *local_70;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> *__range1_1;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end1;
  iterator __begin1;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range1;
  pool_ref<soul::AST::Function> *f;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *__range2;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *functions;
  Module *m_local;
  ModuleBase *module_local;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *this;
  
  if (((m->isProcessor & 1U) == 0) && ((m->isGraph & 1U) == 0)) {
    bVar1 = shouldIncludeComment(&m->comment);
    if (bVar1) {
      module_local._7_1_ = true;
    }
    else {
      iVar2 = (*(module->super_ASTObject)._vptr_ASTObject[0xc])();
      this = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
              *)CONCAT44(extraout_var,iVar2);
      if (this != (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                   *)0x0) {
        __end2 = std::
                 vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                 ::begin(this);
        f = (pool_ref<soul::AST::Function> *)
            std::
            vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
            ::end(this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                                           *)&f), bVar1) {
          this_00 = (pool_ref *)
                    __gnu_cxx::
                    __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                    ::operator*(&__end2);
          f_00 = pool_ref::operator_cast_to_Function_(this_00);
          bVar1 = shouldShow(f_00);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
          ::operator++(&__end2);
        }
      }
      iVar2 = (*(module->super_ASTObject)._vptr_ASTObject[0xb])();
      __end1 = std::
               vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
               ::begin((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                        *)CONCAT44(extraout_var_00,iVar2));
      v = (pool_ref<soul::AST::VariableDeclaration> *)
          std::
          vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
          ::end((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                 *)CONCAT44(extraout_var_00,iVar2));
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                         *)&v), bVar1) {
        __range1_1 = (ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> *)
                     __gnu_cxx::
                     __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                     ::operator*(&__end1);
        v_00 = pool_ref::operator_cast_to_VariableDeclaration_((pool_ref *)__range1_1);
        bVar1 = shouldShow(v_00);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
        ::operator++(&__end1);
      }
      iVar2 = (*(module->super_Scope)._vptr_Scope[0xe])(&module->super_Scope);
      __begin1_1 = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var_01,iVar2);
      local_70 = (ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> *)&__begin1_1;
      __end1_1 = ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_>::begin(local_70);
      ppVar3 = ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_>::end(local_70);
      for (; __end1_1 != ppVar3; __end1_1 = __end1_1 + 1) {
        pSVar4 = pool_ref::operator_cast_to_StructDeclaration_((pool_ref *)__end1_1);
        bVar1 = shouldShow(pSVar4);
        if (bVar1) {
          return true;
        }
      }
      module_local._7_1_ = false;
    }
  }
  else {
    module_local._7_1_ = true;
  }
  return module_local._7_1_;
}

Assistant:

static bool shouldShow (AST::ModuleBase& module, const SourceCodeModel::Module& m)
{
    if (m.isProcessor || m.isGraph)
        return true;

    if (shouldIncludeComment (m.comment))
        return true;

    if (auto functions = module.getFunctionList())
        for (auto& f : *functions)
            if (shouldShow (f))
                return true;

    for (auto& v : module.getStateVariableList())
        if (shouldShow (v))
            return true;

    for (auto& s : module.getStructDeclarations())
        if (shouldShow (s))
            return true;

    return false;
}